

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O0

void __thiscall
KktChStep::passSolution
          (KktChStep *this,vector<double,_std::allocator<double>_> *colVal,
          vector<double,_std::allocator<double>_> *colDu,
          vector<double,_std::allocator<double>_> *rDu)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  int *in_RDI;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  vector<int,_std::allocator<int>_> eqIndexOfReduROW;
  vector<int,_std::allocator<int>_> eqIndexOfReduced;
  int j;
  int i_1;
  int i;
  int nC;
  int nR;
  vector<int,_std::allocator<int>_> cIndex;
  vector<int,_std::allocator<int>_> rIndex;
  allocator_type *in_stack_fffffffffffffea8;
  value_type vVar6;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  size_type in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  vector<double,_std::allocator<double>_> *this_00;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  vector<int,_std::allocator<int>_> local_c0;
  undefined4 local_a4;
  vector<int,_std::allocator<int>_> local_a0;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  undefined4 local_6c;
  vector<int,_std::allocator<int>_> local_68;
  undefined4 local_3c;
  vector<int,_std::allocator<int>_> local_38;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(local_20);
  in_RDI[0x3f] = (int)sVar2;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(local_18);
  in_RDI[0x3e] = (int)sVar2;
  local_3c = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x1bfd37);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8,(value_type *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  std::allocator<int>::~allocator((allocator<int> *)0x1bfd6b);
  local_6c = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x1bfd95);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8,(value_type *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  std::allocator<int>::~allocator((allocator<int> *)0x1bfdc3);
  local_74 = 0;
  local_78 = 0;
  for (local_7c = 0; local_7c < in_RDI[1]; local_7c = local_7c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_7c);
    iVar1 = local_74;
    if (*pvVar3 != 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_7c);
      *pvVar3 = iVar1;
      local_74 = local_74 + 1;
    }
  }
  for (local_80 = 0; local_80 < *in_RDI; local_80 = local_80 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),(long)local_80);
    iVar1 = local_78;
    if (*pvVar3 != 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)local_80);
      *pvVar3 = iVar1;
      local_78 = local_78 + 1;
    }
  }
  local_84 = 0;
  local_a4 = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x1bff76);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8,(value_type *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  std::allocator<int>::~allocator((allocator<int> *)0x1bffa4);
  std::allocator<int>::allocator((allocator<int> *)0x1bffd2);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8,(value_type *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  std::allocator<int>::~allocator((allocator<int> *)0x1c0000);
  for (local_cc = 0; local_cc < *in_RDI; local_cc = local_cc + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)local_cc);
    if (-1 < *pvVar3) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,(long)local_84);
      *pvVar3 = local_cc;
      local_84 = local_84 + 1;
    }
  }
  local_84 = 0;
  for (local_d0 = 0; local_d0 < in_RDI[1]; local_d0 = local_d0 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_d0);
    if (-1 < *pvVar3) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,(long)local_84);
      *pvVar3 = local_d0;
      local_84 = local_84 + 1;
    }
  }
  for (local_d4 = 0; local_d4 < in_RDI[0x3e]; local_d4 = local_d4 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_d4);
    vVar6 = *pvVar4;
    in_stack_fffffffffffffeb0 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x72);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,(long)local_d4);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffeb0,(long)*pvVar3);
    *pvVar5 = vVar6;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_d4);
    vVar6 = *pvVar4;
    this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x78);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_a0,(long)local_d4);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar3);
    *pvVar5 = vVar6;
  }
  for (local_d8 = 0; local_d8 < in_RDI[0x3f]; local_d8 = local_d8 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_d8);
    vVar6 = *pvVar4;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,(long)local_d8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7e),(long)*pvVar3);
    *pvVar5 = vVar6;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void KktChStep::passSolution(const vector<double>& colVal, const vector<double>& colDu, const vector<double>& rDu) {

	colValue.resize(RnumCol);
	colDual.resize(RnumCol);
	rowDual.resize(RnumRow);
	
	numRow = rDu.size();
	numCol = colDu.size();
	//arrays to keep track of indices
	vector<int> rIndex(RnumRow, -1);
	vector<int> cIndex(RnumCol, -1);
	int nR = 0;
	int nC = 0;
	
	for (int i=0;i<RnumRow;i++)
		if (flagRow[i]) {
			rIndex[i] = nR;
			nR++;
			}
			
	for (int i=0;i<RnumCol;i++)
		if (flagCol[i]) {
			cIndex[i] = nC;
			nC++;
		}
		
	//set corresponding parts of solution vectors:
	int j=0;
	vector<int> eqIndexOfReduced(numCol, -1);
	vector<int> eqIndexOfReduROW(numRow, -1);
	for (int i=0;i<RnumCol;i++)
		if (cIndex[i]>-1) {
			eqIndexOfReduced[j] = i;
			j++;
		}
	j=0;
	for (int i=0;i<RnumRow;i++)
		if (rIndex[i]>-1) {
			eqIndexOfReduROW[j] = i;
			j++;
		}
	
	for (int i=0;i<numCol;i++) {
		colValue[eqIndexOfReduced[i]] = colVal[i];
		colDual[eqIndexOfReduced[i]] = colDu[i];
	}
	
	for (int i=0;i<numRow;i++)
		rowDual[eqIndexOfReduROW[i]] = rDu[i];
	
}